

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>::push_back
          (SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false> *this,LocationList *Elt
          )

{
  uint64_t *puVar1;
  uint uVar2;
  
  uVar2 = (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
          super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
      super_SmallVectorBase.Capacity <= uVar2) {
    grow(this,0);
    uVar2 = (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
            super_SmallVectorBase.Size;
  }
  puVar1 = (uint64_t *)
           ((long)(this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
                  super_SmallVectorBase.BeginX + (ulong)uVar2 * 0x68);
  *puVar1 = Elt->Offset;
  SmallVector<llvm::DWARFDebugLoc::Entry,_2U>::SmallVector
            ((SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *)(puVar1 + 1),&Elt->Entries);
  uVar2 = (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
          super_SmallVectorBase.Size;
  if (uVar2 < (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
              super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>).
    super_SmallVectorBase.Size = uVar2 + 1;
    return;
  }
  __assert_fail("N <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(T &&Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void*) this->end()) T(::std::move(Elt));
    this->set_size(this->size() + 1);
  }